

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O3

void __thiscall mocker::detail::RegisterAllocator::~RegisterAllocator(RegisterAllocator *this)

{
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->spilledLastTime)._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->moveInfo).associatedMoves._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->moveInfo).worklist._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->moveInfo).coalesced._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->moveInfo).frozen._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->moveInfo).constrained._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&this->moveInfo);
  InterferenceGraph::~InterferenceGraph(&this->interG);
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}